

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int isAuxiliaryVtabOperator(sqlite3 *db,Expr *pExpr,uchar *peOp2,Expr **ppLeft,Expr **ppRight)

{
  Expr *pEVar1;
  int iVar2;
  VTable *pVVar3;
  Expr *t;
  Expr *pRight;
  Expr *pLeft;
  undefined1 local_70 [4];
  int res;
  void *pNotUsed;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xNotUsed;
  sqlite3_module *pMod;
  sqlite3_vtab *pVtab;
  SrcList *pSStack_48;
  int i;
  Expr *pCol;
  ExprList *pList;
  Expr **ppRight_local;
  Expr **ppLeft_local;
  uchar *peOp2_local;
  Expr *pExpr_local;
  sqlite3 *db_local;
  
  if (pExpr->op == 0xa1) {
    pCol = (Expr *)(pExpr->x).pSelect;
    if (((Select *)pCol == (Select *)0x0) || (*(int *)&((Select *)pCol)->pEList != 2)) {
      return 0;
    }
    pSStack_48 = ((Select *)pCol)->pSrc;
    pList = (ExprList *)ppRight;
    ppRight_local = ppLeft;
    ppLeft_local = (Expr **)peOp2;
    peOp2_local = &pExpr->op;
    pExpr_local = (Expr *)db;
    if (((char)pSStack_48->nSrc == -0x5e) &&
       (*(int *)(*(long *)&pSStack_48->a[0].regResult + 0x54) != 0)) {
      for (pVtab._4_4_ = 0; pVtab._4_4_ < 4; pVtab._4_4_ = pVtab._4_4_ + 1) {
        iVar2 = sqlite3StrICmp(*(char **)(peOp2_local + 8),
                               isAuxiliaryVtabOperator::aOp[pVtab._4_4_].zOp);
        if (iVar2 == 0) {
          *(uchar *)ppLeft_local = isAuxiliaryVtabOperator::aOp[pVtab._4_4_].eOp2;
          *(anon_union_8_2_443a03b8_for_u *)pList = pCol->u;
          *ppRight_local = (Expr *)pSStack_48;
          return 1;
        }
      }
    }
    pSStack_48 = (SrcList *)(pCol->u).zToken;
    if ((((Expr *)pSStack_48)->op == 0xa2) && (((((Expr *)pSStack_48)->y).pTab)->nModuleArg != 0)) {
      pVVar3 = sqlite3GetVTable((sqlite3 *)pExpr_local,(((Expr *)pSStack_48)->y).pTab);
      pMod = (sqlite3_module *)pVVar3->pVtab;
      xNotUsed = *(_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr **)pMod;
      if ((*(long *)(xNotUsed + 0x90) != 0) &&
         (iVar2 = (**(code **)(xNotUsed + 0x90))
                            (pMod,2,*(undefined8 *)(peOp2_local + 8),&pNotUsed,local_70),
         0x95 < iVar2)) {
        *(char *)ppLeft_local = (char)iVar2;
        iVar2 = pCol->iTable;
        pList->nExpr = pCol->nHeight;
        *(int *)&pList->field_0x4 = iVar2;
        *ppRight_local = (Expr *)pSStack_48;
        return 1;
      }
    }
  }
  else if (((pExpr->op == '4') || (pExpr->op == 0xa0)) || (pExpr->op == '3')) {
    pLeft._4_4_ = 0;
    pRight = pExpr->pLeft;
    pEVar1 = pExpr->pRight;
    if ((pRight->op == 0xa2) && (((pRight->y).pTab)->nModuleArg != 0)) {
      pLeft._4_4_ = 1;
    }
    t = pEVar1;
    if (((pEVar1 != (Expr *)0x0) && (pEVar1->op == 0xa2)) && (((pEVar1->y).pTab)->nModuleArg != 0))
    {
      pLeft._4_4_ = pLeft._4_4_ + 1;
      t = pRight;
      pRight = pEVar1;
    }
    *ppLeft = pRight;
    *ppRight = t;
    if (pExpr->op == '4') {
      *peOp2 = 'D';
    }
    if (pExpr->op == 0xa0) {
      *peOp2 = 'E';
    }
    if (pExpr->op == '3') {
      *peOp2 = 'F';
    }
    return pLeft._4_4_;
  }
  return 0;
}

Assistant:

static int isAuxiliaryVtabOperator(
  sqlite3 *db,                    /* Parsing context */
  Expr *pExpr,                    /* Test this expression */
  unsigned char *peOp2,           /* OUT: 0 for MATCH, or else an op2 value */
  Expr **ppLeft,                  /* Column expression to left of MATCH/op2 */
  Expr **ppRight                  /* Expression to left of MATCH/op2 */
){
  if( pExpr->op==TK_FUNCTION ){
    static const struct Op2 {
      const char *zOp;
      unsigned char eOp2;
    } aOp[] = {
      { "match",  SQLITE_INDEX_CONSTRAINT_MATCH },
      { "glob",   SQLITE_INDEX_CONSTRAINT_GLOB },
      { "like",   SQLITE_INDEX_CONSTRAINT_LIKE },
      { "regexp", SQLITE_INDEX_CONSTRAINT_REGEXP }
    };
    ExprList *pList;
    Expr *pCol;                     /* Column reference */
    int i;

    pList = pExpr->x.pList;
    if( pList==0 || pList->nExpr!=2 ){
      return 0;
    }

    /* Built-in operators MATCH, GLOB, LIKE, and REGEXP attach to a
    ** virtual table on their second argument, which is the same as
    ** the left-hand side operand in their in-fix form.
    **
    **       vtab_column MATCH expression
    **       MATCH(expression,vtab_column)
    */
    pCol = pList->a[1].pExpr;
    if( pCol->op==TK_COLUMN && IsVirtual(pCol->y.pTab) ){
      for(i=0; i<ArraySize(aOp); i++){
        if( sqlite3StrICmp(pExpr->u.zToken, aOp[i].zOp)==0 ){
          *peOp2 = aOp[i].eOp2;
          *ppRight = pList->a[0].pExpr;
          *ppLeft = pCol;
          return 1;
        }
      }
    }

    /* We can also match against the first column of overloaded
    ** functions where xFindFunction returns a value of at least
    ** SQLITE_INDEX_CONSTRAINT_FUNCTION.
    **
    **      OVERLOADED(vtab_column,expression)
    **
    ** Historically, xFindFunction expected to see lower-case function
    ** names.  But for this use case, xFindFunction is expected to deal
    ** with function names in an arbitrary case.
    */
    pCol = pList->a[0].pExpr;
    if( pCol->op==TK_COLUMN && IsVirtual(pCol->y.pTab) ){
      sqlite3_vtab *pVtab;
      sqlite3_module *pMod;
      void (*xNotUsed)(sqlite3_context*,int,sqlite3_value**);
      void *pNotUsed;
      pVtab = sqlite3GetVTable(db, pCol->y.pTab)->pVtab;
      assert( pVtab!=0 );
      assert( pVtab->pModule!=0 );
      pMod = (sqlite3_module *)pVtab->pModule;
      if( pMod->xFindFunction!=0 ){
        i = pMod->xFindFunction(pVtab,2, pExpr->u.zToken, &xNotUsed, &pNotUsed);
        if( i>=SQLITE_INDEX_CONSTRAINT_FUNCTION ){
          *peOp2 = i;
          *ppRight = pList->a[1].pExpr;
          *ppLeft = pCol;
          return 1;
        }
      }
    }
  }else if( pExpr->op==TK_NE || pExpr->op==TK_ISNOT || pExpr->op==TK_NOTNULL ){
    int res = 0;
    Expr *pLeft = pExpr->pLeft;
    Expr *pRight = pExpr->pRight;
    if( pLeft->op==TK_COLUMN && IsVirtual(pLeft->y.pTab) ){
      res++;
    }
    if( pRight && pRight->op==TK_COLUMN && IsVirtual(pRight->y.pTab) ){
      res++;
      SWAP(Expr*, pLeft, pRight);
    }
    *ppLeft = pLeft;
    *ppRight = pRight;
    if( pExpr->op==TK_NE ) *peOp2 = SQLITE_INDEX_CONSTRAINT_NE;
    if( pExpr->op==TK_ISNOT ) *peOp2 = SQLITE_INDEX_CONSTRAINT_ISNOT;
    if( pExpr->op==TK_NOTNULL ) *peOp2 = SQLITE_INDEX_CONSTRAINT_ISNOTNULL;
    return res;
  }
  return 0;
}